

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O2

matrix4 * matrix4_scalev3(matrix4 *self,vector3 *scale)

{
  anon_union_128_5_d0a4420b_for_matrix4_0 local_88;
  
  local_88.m[3] = 0.0;
  local_88.m[4] = 0.0;
  local_88.m[1] = 0.0;
  local_88.m[2] = 0.0;
  local_88.m[6] = 0.0;
  local_88.m[7] = 0.0;
  local_88.m[8] = 0.0;
  local_88.m[9] = 0.0;
  local_88.m[0xb] = 0.0;
  local_88.m[0xc] = 0.0;
  local_88.m[0xd] = 0.0;
  local_88.m[0xe] = 0.0;
  local_88.m[0xf] = 1.0;
  local_88.m[0] = (scale->field_0).v[0];
  local_88.m[5] = (scale->field_0).v[1];
  local_88.m[10] = (scale->field_0).v[2];
  matrix4_multiply(self,(matrix4 *)&local_88.field_1);
  return self;
}

Assistant:

HYPAPI struct matrix4 *matrix4_scalev3(struct matrix4 *self, const struct vector3 *scale)
{
	struct matrix4 scalingMatrix;

	return matrix4_multiply(self,
		matrix4_make_transformation_scalingv3(&scalingMatrix, scale));
}